

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O2

void us32_to_us16_test(int line,UTF_US32 *str1,UTF_US16 *str2,bool ok)

{
  pointer pcVar1;
  int line_00;
  bool bVar2;
  int iVar3;
  undefined2 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  UTF_US16 tmp;
  UTF_UC16 buf [256];
  UTF_UC16 local_260;
  short sStack_25e;
  int local_25c;
  UTF_US16 local_258;
  UTF_UC16 local_238;
  short asStack_236 [259];
  
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = L'\0';
  bVar2 = UTF_U_to_u<(char)63>(str1,&local_258);
  UTF_test(line,bVar2 == ok);
  bVar2 = std::operator==(&local_258,str2);
  UTF_test(line,bVar2);
  pcVar1 = (str1->_M_dataplus)._M_p;
  lVar8 = str1->_M_string_length << 2;
  lVar7 = 0;
  lVar5 = 0;
  local_25c = line;
  do {
    puVar4 = (undefined2 *)((long)&local_238 + lVar5);
    if (lVar8 == lVar7) {
LAB_00101d1a:
      line_00 = local_25c;
      *puVar4 = 0;
      UTF_test(local_25c,lVar8 == lVar7);
      iVar3 = UTF_uj16_cmpn(local_258._M_dataplus._M_p,&local_238,local_258._M_string_length + 1);
      UTF_test(line_00,iVar3 == 0);
      std::__cxx11::u16string::~u16string((u16string *)&local_258);
      return;
    }
    bVar2 = UTF_uc32_to_uc16(*(UTF_UC32 *)((long)pcVar1 + lVar7),&local_260);
    if (!bVar2) {
      _local_260 = 0x3f;
    }
    if (lVar5 == 0x1fe) goto LAB_00101d1a;
    lVar6 = lVar5 + 2;
    *(UTF_UC16 *)((long)&local_238 + lVar5) = local_260;
    if (sStack_25e != 0) {
      if (lVar6 == 0x1fe) {
        puVar4 = (undefined2 *)((long)asStack_236 + lVar5);
        goto LAB_00101d1a;
      }
      *(short *)((long)asStack_236 + lVar5) = sStack_25e;
      lVar6 = lVar5 + 4;
    }
    lVar7 = lVar7 + 4;
    lVar5 = lVar6;
  } while( true );
}

Assistant:

void us32_to_us16_test(int line, const UTF_US32& str1, const UTF_US16& str2, bool ok)
{
    UTF_US16 tmp;
    UTF_UC16 buf[256];
    UTF_test(line, UTF_U_to_u<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_uj32_to_uj16(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj16_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}